

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O0

int run_test_tty_pty(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  undefined8 uVar2;
  undefined1 local_5e0 [8];
  uv_tty_t slave_tty;
  uv_tty_t master_tty;
  uv_loop_t loop;
  winsize w;
  int r;
  int slave_fd;
  int master_fd;
  
  iVar1 = uv_loop_init(&master_tty.orig_termios.c_ospeed);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
            ,0x1b3,"0 == uv_loop_init(&loop)");
    abort();
  }
  w._0_4_ = openpty(&r,&w.ws_xpixel,0,0,&loop.inotify_fd);
  if (w._0_4_ == 0) {
    iVar1 = uv_tty_init(&master_tty.orig_termios.c_ospeed,local_5e0,w._4_4_,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
              ,0x1b9,"0 == uv_tty_init(&loop, &slave_tty, slave_fd, 0)");
      abort();
    }
    iVar1 = uv_tty_init(&master_tty.orig_termios.c_ospeed,&slave_tty.orig_termios.c_ospeed,r,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
              ,0x1ba,"0 == uv_tty_init(&loop, &master_tty, master_fd, 0)");
      abort();
    }
    iVar1 = uv_is_readable(local_5e0);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
              ,0x1bb,"uv_is_readable((uv_stream_t*) &slave_tty)");
      abort();
    }
    iVar1 = uv_is_writable(local_5e0);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
              ,0x1bc,"uv_is_writable((uv_stream_t*) &slave_tty)");
      abort();
    }
    iVar1 = uv_is_readable(&slave_tty.orig_termios.c_ospeed);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
              ,0x1bd,"uv_is_readable((uv_stream_t*) &master_tty)");
      abort();
    }
    iVar1 = uv_is_writable(&slave_tty.orig_termios.c_ospeed);
    if (iVar1 == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
              ,0x1be,"uv_is_writable((uv_stream_t*) &master_tty)");
      abort();
    }
    if (((uint)slave_tty.next_closing & 0x100000) != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
              ,0x1c2,"0 == (slave_tty.flags & 0x100000)");
      abort();
    }
    if (((uint)master_tty.next_closing & 0x100000) == 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
              ,0x1c5,"master_tty.flags & 0x100000");
      abort();
    }
    iVar1 = close(w._4_4_);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
              ,0x1c6,"0 == close(slave_fd)");
      abort();
    }
    uv_close(local_5e0,0);
    iVar1 = close(r);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
              ,0x1c8,"0 == close(master_fd)");
      abort();
    }
    uv_close(&slave_tty.orig_termios.c_ospeed,0);
    iVar1 = uv_run(&master_tty.orig_termios.c_ospeed,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
              ,0x1cb,"0 == uv_run(&loop, UV_RUN_DEFAULT)");
      abort();
    }
    loop_00 = (uv_loop_t *)uv_default_loop();
    close_loop(loop_00);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tty.c"
              ,0x1cd,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    slave_fd = 0;
  }
  else {
    fprintf(_stderr,"%s\n","No pty available, skipping.");
    fflush(_stderr);
    slave_fd = 1;
  }
  return slave_fd;
}

Assistant:

TEST_IMPL(tty_pty) {
#if defined(__APPLE__)                            || \
    defined(__DragonFly__)                        || \
    defined(__FreeBSD__)                          || \
    defined(__FreeBSD_kernel__)                   || \
    (defined(__linux__) && !defined(__ANDROID__)) || \
    defined(__NetBSD__)                           || \
    defined(__OpenBSD__)
  int master_fd, slave_fd, r;
  struct winsize w;
  uv_loop_t loop;
  uv_tty_t master_tty, slave_tty;

  ASSERT(0 == uv_loop_init(&loop));

  r = openpty(&master_fd, &slave_fd, NULL, NULL, &w);
  if (r != 0)
    RETURN_SKIP("No pty available, skipping.");

  ASSERT(0 == uv_tty_init(&loop, &slave_tty, slave_fd, 0));
  ASSERT(0 == uv_tty_init(&loop, &master_tty, master_fd, 0));
  ASSERT(uv_is_readable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_readable((uv_stream_t*) &master_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &master_tty));
  /* Check if the file descriptor was reopened. If it is,
   * UV_HANDLE_BLOCKING_WRITES (value 0x100000) isn't set on flags.
   */
  ASSERT(0 == (slave_tty.flags & 0x100000));
  /* The master_fd of a pty should never be reopened.
   */
  ASSERT(master_tty.flags & 0x100000);
  ASSERT(0 == close(slave_fd));
  uv_close((uv_handle_t*) &slave_tty, NULL);
  ASSERT(0 == close(master_fd));
  uv_close((uv_handle_t*) &master_tty, NULL);

  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
#endif
  return 0;
}